

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O3

wchar_t pm_w(wchar_t *p,wchar_t *s,wchar_t flags)

{
  bool bVar1;
  bool bVar2;
  wchar_t wVar3;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  bool bVar9;
  
  if ((*s == L'.') && (s[1] == L'/')) {
    s = s + 1;
    wVar3 = L'/';
    do {
      if (wVar3 == L'.') {
        wVar3 = s[1];
        if ((wVar3 != L'/') && (wVar3 != L'\0')) break;
      }
      else {
        if (wVar3 != L'/') break;
        wVar3 = s[1];
      }
      s = s + 1;
    } while( true );
  }
  if ((*p == L'.') && (p[1] == L'/')) {
    p = p + 1;
    wVar3 = L'/';
    do {
      if (wVar3 == L'.') {
        wVar3 = p[1];
        if ((wVar3 != L'/') && (wVar3 != L'\0')) break;
      }
      else {
        if (wVar3 != L'/') break;
        wVar3 = p[1];
      }
      p = p + 1;
    } while( true );
  }
LAB_004d7f41:
  wVar3 = *p;
  if (wVar3 < L'?') {
    if (wVar3 < L'*') {
      if (wVar3 == L'$') {
        if (((flags & 2U) != 0) && (p[1] == L'\0')) goto LAB_004d8166;
      }
      else if (wVar3 == L'\0') {
        wVar3 = *s;
        if (wVar3 != L'/') goto LAB_004d81f1;
        bVar9 = true;
        if ((flags & 2U) != 0) goto LAB_004d81f6;
        wVar3 = L'/';
        goto LAB_004d81a6;
      }
    }
    else {
      if (wVar3 == L'/') {
        wVar3 = *s;
        if ((wVar3 == L'/') || (wVar3 == L'\0')) {
          p = p + -1;
          wVar6 = L'/';
          do {
            if (wVar6 == L'.') {
              wVar7 = p[2];
              if ((wVar7 != L'\0') && (wVar7 != L'/')) goto LAB_004d8033;
            }
            else {
              if (wVar6 != L'/') goto LAB_004d8033;
              wVar7 = p[2];
            }
            wVar6 = wVar7;
            p = p + 1;
          } while( true );
        }
        goto LAB_004d81ea;
      }
      if (wVar3 == L'*') goto LAB_004d8181;
    }
LAB_004d8131:
    if (wVar3 != *s) goto LAB_004d81ea;
  }
  else if (wVar3 == L'?') {
    if (*s == L'\0') goto LAB_004d81ea;
  }
  else {
    if (wVar3 == L'[') {
      pwVar5 = p + 1;
      pwVar4 = pwVar5;
      do {
        wVar3 = *pwVar4;
        if (wVar3 == L'\\') {
          if (pwVar4[1] != L'\0') {
            pwVar4 = pwVar4 + 1;
          }
        }
        else {
          if (wVar3 == L'\0') {
            if (*s != L'[') goto LAB_004d81ea;
            goto LAB_004d8147;
          }
          if (wVar3 == L']') goto LAB_004d806f;
        }
        pwVar4 = pwVar4 + 1;
      } while( true );
    }
    if (wVar3 != L'\\') goto LAB_004d8131;
    if (p[1] == L'\0') {
      if (*s == L'\\') goto LAB_004d8147;
      goto LAB_004d81ea;
    }
    if (p[1] != *s) goto LAB_004d81ea;
    p = p + 1;
  }
LAB_004d8147:
  p = p + 1;
  s = s + 1;
  goto LAB_004d7f41;
LAB_004d8033:
  s = s + -1;
  do {
    if (wVar3 == L'.') {
      wVar3 = s[2];
      if ((wVar3 != L'/') && (wVar3 != L'\0')) break;
    }
    else {
      if (wVar3 != L'/') break;
      wVar3 = s[2];
    }
    s = s + 1;
  } while( true );
  if (((flags & 2U) != 0) && (wVar6 == L'\0')) goto LAB_004d818a;
  goto LAB_004d8147;
LAB_004d8181:
  while (wVar3 == L'*') {
    pwVar5 = p + 1;
    p = p + 1;
    wVar3 = *pwVar5;
  }
  if (wVar3 == L'\0') {
LAB_004d818a:
    bVar9 = true;
  }
  else if (*s == L'\0') {
LAB_004d81ea:
    bVar9 = false;
  }
  else {
    do {
      wVar3 = __archive_pathmatch_w(p,s,flags);
      bVar9 = wVar3 != L'\0';
      if (bVar9) break;
      pwVar5 = s + 1;
      s = s + 1;
    } while (*pwVar5 != L'\0');
  }
  goto LAB_004d81f6;
LAB_004d8166:
  do {
    do {
      pwVar5 = s + 1;
      wVar3 = *s;
      s = pwVar5;
    } while (wVar3 == L'/');
  } while ((wVar3 == L'.') && ((*pwVar5 == L'/' || (*pwVar5 == L'\0'))));
  goto LAB_004d81f1;
LAB_004d806f:
  bVar2 = false;
  bVar9 = true;
  if (((*pwVar5 == L'^') || (*pwVar5 == L'!')) && (pwVar5 < pwVar4)) {
    pwVar5 = p + 2;
    bVar2 = true;
    bVar9 = false;
  }
  bVar1 = bVar2;
  if (pwVar5 < pwVar4) {
    wVar3 = *s;
    wVar6 = L'\0';
    do {
      wVar7 = *pwVar5;
      bVar1 = bVar9;
      if (wVar7 == L'\\') {
        wVar7 = pwVar5[1];
        pwVar5 = pwVar5 + 1;
LAB_004d80dc:
        if (wVar7 == wVar3) break;
      }
      else {
        if (wVar7 != L'-') goto LAB_004d80dc;
        if ((wVar6 == L'\0') || (pwVar5 == pwVar4 + -1)) {
          wVar7 = L'\0';
          if (wVar3 == L'-') break;
        }
        else {
          wVar8 = pwVar5[1];
          if (wVar8 == L'\\') {
            wVar8 = pwVar5[2];
            pwVar5 = pwVar5 + 2;
          }
          else {
            pwVar5 = pwVar5 + 1;
          }
          wVar7 = L'\0';
          if ((wVar6 <= wVar3) && (wVar3 <= wVar8)) break;
        }
      }
      pwVar5 = pwVar5 + 1;
      wVar6 = wVar7;
      bVar1 = bVar2;
    } while (pwVar5 < pwVar4);
  }
  p = pwVar4;
  if (!bVar1) goto LAB_004d81ea;
  goto LAB_004d8147;
  while ((wVar3 = *s, wVar3 == L'/' || (wVar3 == L'\0'))) {
LAB_004d81a6:
    pwVar5 = s;
    s = pwVar5 + 1;
    if (wVar3 != L'.') {
      if (wVar3 != L'/') break;
      wVar3 = *s;
      goto LAB_004d81a6;
    }
  }
  wVar3 = *pwVar5;
LAB_004d81f1:
  bVar9 = wVar3 == L'\0';
LAB_004d81f6:
  return (wchar_t)bVar9;
}

Assistant:

static int
pm_w(const wchar_t *p, const wchar_t *s, int flags)
{
	const wchar_t *end;

	/*
	 * Ignore leading './', './/', '././', etc.
	 */
	if (s[0] == L'.' && s[1] == L'/')
		s = pm_slashskip_w(s + 1);
	if (p[0] == L'.' && p[1] == L'/')
		p = pm_slashskip_w(p + 1);

	for (;;) {
		switch (*p) {
		case L'\0':
			if (s[0] == L'/') {
				if (flags & PATHMATCH_NO_ANCHOR_END)
					return (1);
				/* "dir" == "dir/" == "dir/." */
				s = pm_slashskip_w(s);
			}
			return (*s == L'\0');
		case L'?':
			/* ? always succeeds, unless we hit end of 's' */
			if (*s == L'\0')
				return (0);
			break;
		case L'*':
			/* "*" == "**" == "***" ... */
			while (*p == L'*')
				++p;
			/* Trailing '*' always succeeds. */
			if (*p == L'\0')
				return (1);
			while (*s) {
				if (archive_pathmatch_w(p, s, flags))
					return (1);
				++s;
			}
			return (0);
		case L'[':
			/*
			 * Find the end of the [...] character class,
			 * ignoring \] that might occur within the class.
			 */
			end = p + 1;
			while (*end != L'\0' && *end != L']') {
				if (*end == L'\\' && end[1] != L'\0')
					++end;
				++end;
			}
			if (*end == L']') {
				/* We found [...], try to match it. */
				if (!pm_list_w(p + 1, end, *s, flags))
					return (0);
				p = end; /* Jump to trailing ']' char. */
				break;
			} else
				/* No final ']', so just match '['. */
				if (*p != *s)
					return (0);
			break;
		case L'\\':
			/* Trailing '\\' matches itself. */
			if (p[1] == L'\0') {
				if (*s != L'\\')
					return (0);
			} else {
				++p;
				if (*p != *s)
					return (0);
			}
			break;
		case L'/':
			if (*s != L'/' && *s != L'\0')
				return (0);
			/* Note: pattern "/\./" won't match "/";
			 * pm_slashskip() correctly stops at backslash. */
			p = pm_slashskip_w(p);
			s = pm_slashskip_w(s);
			if (*p == L'\0' && (flags & PATHMATCH_NO_ANCHOR_END))
				return (1);
			--p; /* Counteract the increment below. */
			--s;
			break;
		case L'$':
			/* '$' is special only at end of pattern and only
			 * if PATHMATCH_NO_ANCHOR_END is specified. */
			if (p[1] == L'\0' && (flags & PATHMATCH_NO_ANCHOR_END)){
				/* "dir" == "dir/" == "dir/." */
				return (*pm_slashskip_w(s) == L'\0');
			}
			/* Otherwise, '$' is not special. */
			/* FALL THROUGH */
		default:
			if (*p != *s)
				return (0);
			break;
		}
		++p;
		++s;
	}
}